

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O3

void digactualhole(int x,int y,monst *madeby,int ttyp)

{
  undefined1 *puVar1;
  monst *pmVar2;
  level *plVar3;
  boolean bVar4;
  xchar xVar5;
  schar sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  trap *ptVar10;
  permonst *ppVar11;
  char *pcVar12;
  byte bVar13;
  char cVar14;
  char *pcVar15;
  schar *psVar16;
  long lVar17;
  int iVar18;
  monst *mtmp;
  long lVar19;
  xchar x_00;
  undefined8 unaff_R14;
  undefined7 uVar20;
  bool bVar21;
  int by;
  char surface_type [256];
  undefined4 local_158;
  uint local_154;
  long local_150;
  long local_148;
  long local_140;
  int local_138;
  undefined2 local_134;
  
  plVar3 = level;
  lVar19 = (long)x;
  lVar17 = (long)y;
  local_140 = lVar19 * 0xa8;
  pmVar2 = level->monsters[lVar19][lVar17];
  if (pmVar2 == (monst *)0x0) {
    mtmp = (monst *)0x0;
  }
  else {
    mtmp = (monst *)0x0;
    if ((pmVar2->field_0x61 & 2) == 0) {
      mtmp = pmVar2;
    }
  }
  iVar7 = (int)u.ux;
  iVar18 = (int)u.uy;
  uVar20 = (undefined7)((ulong)unaff_R14 >> 8);
  uVar9 = (uint)CONCAT71(uVar20,1);
  if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
       ((youmonst.data)->mlet != '\x05')) && (u.uprops[0x3c].extrinsic == 0)) &&
     (((youmonst.data)->mflags1 & 1) == 0)) {
    if (u.usteed == (monst *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (uint)CONCAT71(uVar20,(char)(u.usteed)->data->mflags1) & 0xffffff01;
    }
  }
  if ((u.utrap != 0) && (u.utraptype == 4)) {
    u.utrap = 0;
  }
  cVar14 = level->locations[lVar19][lVar17].typ;
  local_148 = lVar17;
  if (cVar14 == '$') {
LAB_001649c2:
    local_158 = y;
    local_138 = x;
    find_drawbridge(&local_138,&local_158);
    destroy_drawbridge(local_138,local_158);
    return;
  }
  if (cVar14 == '\x1f') {
    breaksink(x,y);
    return;
  }
  x_00 = (xchar)x;
  xVar5 = (xchar)y;
  if (cVar14 == '\x1c') {
    dogushforth(0);
    puVar1 = &level->locations[lVar19][lVar17].field_0x6;
    *(uint *)puVar1 = *(uint *)puVar1 | 0x20;
    dryup(x_00,xVar5,madeby == &youmonst);
    return;
  }
  local_154 = uVar9;
  local_150 = lVar19;
  iVar8 = is_drawbridge_wall(x,y);
  if (-1 < iVar8) goto LAB_001649c2;
  psVar16 = &plVar3->locations[lVar19][lVar17].typ;
  lVar17 = local_140;
  iVar8 = 0xb;
  if ((ttyp != 0xb) &&
     (bVar4 = can_dig_down(level), lVar17 = local_140, iVar8 = ttyp, bVar4 == '\0')) {
    impossible("digactualhole: can\'t dig %s on this level.",defexplain[(long)ttyp + 0x2f]);
    iVar8 = 0xb;
  }
  if (*psVar16 == ' ') {
    local_134 = 0x65;
    local_138 = 0x76617267;
    bVar21 = false;
  }
  else {
    pcVar12 = surface(x,y);
    strcpy((char *)&local_138,pcVar12);
    if (*psVar16 == '\x17') {
      pcVar12 = in_rooms(level,x_00,xVar5,0x12);
      bVar21 = *pcVar12 != '\0';
    }
    else {
      bVar21 = false;
    }
  }
  lVar19 = *(long *)((long)level->objects[0] + local_148 * 8 + lVar17);
  ptVar10 = maketrap(level,x,y,iVar8);
  if (ptVar10 == (trap *)0x0) {
    return;
  }
  if (madeby == &youmonst) {
    bVar13 = 0xa0;
  }
  else {
    bVar13 = (viz_array[local_148][local_150] & 2U) << 4;
  }
  lVar17 = *(long *)((long)level->objects[0] + local_148 * 8 + lVar17);
  ptVar10->field_0x8 = ptVar10->field_0x8 & 0x5f | bVar13;
  newsym((int)ptVar10->tx,(int)ptVar10->ty);
  if (iVar8 != 0xb) {
    if (madeby == &youmonst) {
      pline("You dig a hole through the %s.",&local_138);
    }
    else {
      if (madeby != (monst *)0x0) {
        if (madeby->wormno == '\0') {
          if ((viz_array[madeby->my][madeby->mx] & 2U) != 0) goto LAB_00164fda;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00164d39;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00164d30;
          }
          else {
LAB_00164d30:
            if (ublindf == (obj *)0x0) goto LAB_00165041;
LAB_00164d39:
            if (ublindf->oartifact != '\x1d') goto LAB_00165041;
          }
          if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
              (((youmonst.data)->mflags3 & 0x100) == 0)) ||
             (((viz_array[madeby->my][madeby->mx] & 1U) == 0 ||
              ((madeby->data->mflags3 & 0x200) == 0)))) goto LAB_00165041;
        }
        else {
          bVar4 = worm_known(level,madeby);
          if (bVar4 == '\0') goto LAB_00165041;
        }
LAB_00164fda:
        uVar9 = *(uint *)&madeby->field_0x60;
        if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar9 & 0x280) == 0) goto LAB_00165018;
        }
        else if (((uVar9 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00165018:
          if ((u._1052_1_ & 0x20) == 0) {
            pcVar12 = Monnam(madeby);
            pline("%s digs a hole through the %s.",pcVar12,&local_138);
            goto LAB_00165096;
          }
        }
      }
LAB_00165041:
      if (((viz_array[local_148][local_150] & 2U) != 0) && (flags.verbose != '\0')) {
        pline("A hole appears in the %s.",&local_138);
      }
    }
LAB_00165096:
    if (iVar18 == y && iVar7 == x) {
      cVar14 = (char)local_154;
      if ((u.ustuck == (monst *)0x0) && (cVar14 == '\0')) {
        bVar4 = next_to_u();
        if (bVar4 == '\0') {
          pline("You are jerked back by your pet!");
          goto LAB_001652d1;
        }
        cVar14 = '\0';
      }
      if ((u.ustuck == (monst *)0x0) && (cVar14 == '\0')) {
        if ((madeby == &youmonst) && (u.ushops[0] != '\0')) {
          shopdig(1);
        }
        else if (madeby != &youmonst) {
          pay_for_damage("dig into",'\x01');
        }
        pline("You fall through...");
        local_158._0_2_ = (d_level)CONCAT11(u.uz.dlevel + '\x01',u.uz.dnum);
        goto_level((d_level *)&local_158,'\0','\x01','\0');
        spoteffects('\0');
        return;
      }
LAB_001652d1:
      if (lVar17 != 0) {
        impact_drop((obj *)0x0,x_00,xVar5,'\0');
      }
      if (lVar19 != lVar17) {
        pickup(1);
      }
      if (!bVar21 || madeby != &youmonst) {
        return;
      }
      pay_for_damage("ruin",'\0');
      return;
    }
    if (bVar21 && madeby == &youmonst) {
      pay_for_damage("ruin",'\0');
    }
    if (lVar17 != 0) {
      impact_drop((obj *)0x0,x_00,xVar5,'\0');
    }
    if (mtmp == (monst *)0x0) {
      return;
    }
    ppVar11 = mtmp->data;
    if ((ppVar11->mflags1 & 1) != 0) {
      return;
    }
    if (ppVar11 == mons + 0x56 || ppVar11->mlet == '\x05') {
      return;
    }
    if (mtmp->wormno != '\0') {
      iVar7 = count_wsegs(mtmp);
      if (5 < iVar7) {
        return;
      }
      ppVar11 = mtmp->data;
    }
    if (3 < ppVar11->msize) {
      return;
    }
    if (mtmp == u.ustuck) {
      return;
    }
    bVar4 = teleport_pet(mtmp,'\0');
    if (bVar4 == '\0') {
      return;
    }
    bVar4 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
    if (bVar4 != '\0') {
      assign_level((d_level *)&local_158,&dungeon_topology.d_valley_level);
LAB_001651f1:
      if ((mtmp->field_0x63 & 2) != 0) {
        make_angry_shk(mtmp,'\0','\0');
      }
      xVar5 = ledger_no((d_level *)&local_158);
      migrate_to_level(mtmp,xVar5,'\0',(coord *)0x0);
      return;
    }
    bVar4 = Is_botlevel(&u.uz);
    if (bVar4 == '\0') {
      sVar6 = depth(&u.uz);
      get_level((d_level *)&local_158,sVar6 + 1);
      goto LAB_001651f1;
    }
    if (mtmp->wormno != '\0') {
      bVar4 = worm_known(level,mtmp);
      if (bVar4 == '\0') {
        return;
      }
      goto LAB_00165539;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00165539;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001654c5;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001654bc;
    }
    else {
LAB_001654bc:
      if (ublindf == (obj *)0x0) {
        return;
      }
LAB_001654c5:
      if (ublindf->oartifact != '\x1d') {
        return;
      }
    }
    if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
       (((youmonst.data)->mflags3 & 0x100) == 0)) {
      return;
    }
    if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
      return;
    }
    if ((mtmp->data->mflags3 & 0x200) == 0) {
      return;
    }
LAB_00165539:
    uVar9 = *(uint *)&mtmp->field_0x60;
    if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar9 & 0x280) != 0) {
        return;
      }
    }
    else {
      if ((uVar9 & 0x280) != 0) {
        return;
      }
      if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
        return;
      }
    }
    if ((u._1052_1_ & 0x20) != 0) {
      return;
    }
    pcVar12 = Monnam(mtmp);
    pline("%s avoids the trap.",pcVar12);
    return;
  }
  if (madeby == &youmonst) {
    pline("You dig a pit in the %s.",&local_138);
    if (bVar21) {
      pay_for_damage("ruin",'\0');
    }
  }
  else {
    if (madeby != (monst *)0x0) {
      if (madeby->wormno == '\0') {
        if ((viz_array[madeby->my][madeby->mx] & 2U) != 0) goto LAB_00164da3;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00164ce7;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00164cde;
        }
        else {
LAB_00164cde:
          if (ublindf == (obj *)0x0) goto LAB_00164e0b;
LAB_00164ce7:
          if (ublindf->oartifact != '\x1d') goto LAB_00164e0b;
        }
        if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
             (((youmonst.data)->mflags3 & 0x100) == 0)) ||
            ((viz_array[madeby->my][madeby->mx] & 1U) == 0)) ||
           ((madeby->data->mflags3 & 0x200) == 0)) goto LAB_00164e0b;
      }
      else {
        bVar4 = worm_known(level,madeby);
        if (bVar4 == '\0') goto LAB_00164e0b;
      }
LAB_00164da3:
      uVar9 = *(uint *)&madeby->field_0x60;
      if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar9 & 0x280) == 0) goto LAB_00164de2;
      }
      else if (((uVar9 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00164de2:
        if ((u._1052_1_ & 0x20) == 0) {
          pcVar12 = Monnam(madeby);
          pline("%s digs a pit in the %s.",pcVar12,&local_138);
          goto LAB_00164e56;
        }
      }
    }
LAB_00164e0b:
    if (((viz_array[local_148][local_150] & 2U) != 0) && (flags.verbose != '\0')) {
      pline("A pit appears in the %s.",&local_138);
    }
  }
LAB_00164e56:
  if (iVar18 == y && iVar7 == x) {
    if ((char)local_154 == '\0') {
      if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 8) == 0)) {
        uVar9 = mt_random();
        u.utrap = (uVar9 & 3) + 2;
      }
      u.utraptype = 1;
      vision_full_recalc = '\x01';
    }
    else {
      u.utrap = 0;
    }
    if (lVar19 == lVar17) {
      return;
    }
    pickup(1);
    return;
  }
  if (mtmp == (monst *)0x0) {
    return;
  }
  ppVar11 = mtmp->data;
  if (((ppVar11->mflags1 & 1) == 0) && (ppVar11->mlet != '\x05')) {
    if (mtmp == madeby) {
      return;
    }
    mintrap(mtmp);
    return;
  }
  if (mtmp->wormno != '\0') {
    bVar4 = worm_known(level,mtmp);
    if (bVar4 == '\0') {
      return;
    }
    goto LAB_00165390;
  }
  if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00165390;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00164f54;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00164f4b;
  }
  else {
LAB_00164f4b:
    if (ublindf == (obj *)0x0) {
      return;
    }
LAB_00164f54:
    if (ublindf->oartifact != '\x1d') {
      return;
    }
  }
  if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
     (((youmonst.data)->mflags3 & 0x100) == 0)) {
    return;
  }
  if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
    return;
  }
  if ((ppVar11->mflags3 & 0x200) == 0) {
    return;
  }
LAB_00165390:
  uVar9 = *(uint *)&mtmp->field_0x60;
  if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar9 & 0x280) != 0) {
      return;
    }
  }
  else {
    if ((uVar9 & 0x280) != 0) {
      return;
    }
    if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
      return;
    }
  }
  if ((u._1052_1_ & 0x20) != 0) {
    return;
  }
  pcVar12 = Monnam(mtmp);
  pcVar15 = "flies";
  if ((mtmp->data->mflags1 & 1) == 0) {
    pcVar15 = "floats";
  }
  pline("%s %s over the pit.",pcVar12,pcVar15);
  return;
}

Assistant:

void digactualhole(int x, int y, struct monst *madeby, int ttyp)
{
	struct obj *oldobjs, *newobjs;
	struct trap *ttmp;
	char surface_type[BUFSZ];
	struct rm *loc = &level->locations[x][y];
	boolean shopdoor;
	struct monst *mtmp = m_at(level, x, y);	/* may be madeby */
	boolean madeby_u = (madeby == BY_YOU);
	boolean madeby_obj = (madeby == BY_OBJECT);
	boolean at_u = (x == u.ux) && (y == u.uy);
	boolean wont_fall = Levitation || Flying;

	if (u.utrap && u.utraptype == TT_INFLOOR) u.utrap = 0;

	/* these furniture checks were in dighole(), but wand
	   breaking bypasses that routine and calls us directly */
	if (IS_FOUNTAIN(loc->typ)) {
	    dogushforth(FALSE);
	    SET_FOUNTAIN_WARNED(x,y);		/* force dryup */
	    dryup(x, y, madeby_u);
	    return;
	} else if (IS_SINK(loc->typ)) {
	    breaksink(x, y);
	    return;
	} else if (loc->typ == DRAWBRIDGE_DOWN ||
		   (is_drawbridge_wall(x, y) >= 0)) {
	    int bx = x, by = y;
	    /* if under the portcullis, the bridge is adjacent */
	    find_drawbridge(&bx, &by);
	    destroy_drawbridge(bx, by);
	    return;
	}

	if (ttyp != PIT && !can_dig_down(level)) {
	    impossible("digactualhole: can't dig %s on this level.",
		       trapexplain[ttyp-1]);
	    ttyp = PIT;
	}

	/* maketrap(level, ) might change it, also, in this situation,
	   surface() returns an inappropriate string for a grave */
	if (IS_GRAVE(loc->typ))
	    strcpy(surface_type, "grave");
	else
	    strcpy(surface_type, surface(x,y));
	shopdoor = IS_DOOR(loc->typ) && *in_rooms(level, x, y, SHOPBASE);
	oldobjs = level->objects[x][y];
	ttmp = maketrap(level, x, y, ttyp);
	if (!ttmp) return;
	newobjs = level->objects[x][y];
	ttmp->tseen = (madeby_u || cansee(x,y));
	ttmp->madeby_u = madeby_u;
	newsym(ttmp->tx,ttmp->ty);

	if (ttyp == PIT) {

	    if (madeby_u) {
		pline("You dig a pit in the %s.", surface_type);
		if (shopdoor) pay_for_damage("ruin", FALSE);
	    } else if (!madeby_obj && canseemon(level, madeby))
		pline("%s digs a pit in the %s.", Monnam(madeby), surface_type);
	    else if (cansee(x, y) && flags.verbose)
		pline("A pit appears in the %s.", surface_type);

	    if (at_u) {
		if (!wont_fall) {
		    if (!Passes_walls)
			u.utrap = rn1(4,2);
		    u.utraptype = TT_PIT;
		    vision_full_recalc = 1;	/* vision limits change */
		} else
		    u.utrap = 0;
		if (oldobjs != newobjs)	/* something unearthed */
			pickup(1);	/* detects pit */
	    } else if (mtmp) {
		if (is_flyer(mtmp->data) || is_floater(mtmp->data)) {
		    if (canseemon(level, mtmp))
			pline("%s %s over the pit.", Monnam(mtmp),
						     (is_flyer(mtmp->data)) ?
						     "flies" : "floats");
		} else if (mtmp != madeby)
		    mintrap(mtmp);
	    }
	} else {	/* was TRAPDOOR now a HOLE*/

	    if (madeby_u)
		pline("You dig a hole through the %s.", surface_type);
	    else if (!madeby_obj && canseemon(level, madeby))
		pline("%s digs a hole through the %s.",
		      Monnam(madeby), surface_type);
	    else if (cansee(x, y) && flags.verbose)
		pline("A hole appears in the %s.", surface_type);

	    if (at_u) {
		if (!u.ustuck && !wont_fall && !next_to_u()) {
		    pline("You are jerked back by your pet!");
		    wont_fall = TRUE;
		}

		/* Floor objects get a chance of falling down.  The case where
		 * the hero does NOT fall down is treated here.  The case
		 * where the hero does fall down is treated in goto_level().
		 */
		if (u.ustuck || wont_fall) {
		    if (newobjs)
			impact_drop(NULL, x, y, 0);
		    if (oldobjs != newobjs)
			pickup(1);
		    if (shopdoor && madeby_u) pay_for_damage("ruin", FALSE);

		} else {
		    d_level newlevel;

		    if (*u.ushops && madeby_u)
			shopdig(1); /* shk might snatch pack */
		    /* handle earlier damage, eg breaking wand of digging */
		    else if (!madeby_u) pay_for_damage("dig into", TRUE);

		    pline("You fall through...");
		    /* Earlier checks must ensure that the destination
		     * level exists and is in the present dungeon.
		     */
		    newlevel.dnum = u.uz.dnum;
		    newlevel.dlevel = u.uz.dlevel + 1;
		    goto_level(&newlevel, FALSE, TRUE, FALSE);
		    /* messages for arriving in special rooms */
		    spoteffects(FALSE);
		}
	    } else {
		if (shopdoor && madeby_u) pay_for_damage("ruin", FALSE);
		if (newobjs)
		    impact_drop(NULL, x, y, 0);
		if (mtmp) {
		     /*[don't we need special sokoban handling here?]*/
		    if (is_flyer(mtmp->data) || is_floater(mtmp->data) ||
		        mtmp->data == &mons[PM_WUMPUS] ||
			(mtmp->wormno && count_wsegs(mtmp) > 5) ||
			mtmp->data->msize >= MZ_HUGE) return;
		    if (mtmp == u.ustuck)	/* probably a vortex */
			    return;		/* temporary? kludge */

		    if (teleport_pet(mtmp, FALSE)) {
			d_level tolevel;

			if (Is_stronghold(&u.uz)) {
			    assign_level(&tolevel, &valley_level);
			} else if (Is_botlevel(&u.uz)) {
			    if (canseemon(level, mtmp))
				pline("%s avoids the trap.", Monnam(mtmp));
			    return;
			} else {
			    get_level(&tolevel, depth(&u.uz) + 1);
			}
			if (mtmp->isshk) make_angry_shk(mtmp, 0, 0);
			migrate_to_level(mtmp, ledger_no(&tolevel),
					 MIGR_RANDOM, NULL);
		    }
		}
	    }
	}
}